

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_canbus.cc
# Opt level: O2

string * __thiscall
ccel::canbus::canbus_handler::interface_name_abi_cxx11_
          (string *__return_storage_ptr__,canbus_handler *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_interface_name);
  return __return_storage_ptr__;
}

Assistant:

std::string canbus_handler::interface_name() { return _interface_name; }